

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

bool __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_>::isUnused
          (iterator<QHashPrivate::Node<QMakeBaseKey,_QMakeBaseEnv_*>_> *this)

{
  return this->d->spans[this->bucket >> 7].offsets[(uint)this->bucket & 0x7f] == 0xff;
}

Assistant:

inline bool isUnused() const noexcept { return !d->spans[span()].hasNode(index()); }